

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O2

void idx2::DecompressBufZstd(buffer *Input,bitstream *Output)

{
  long lVar1;
  unsigned_long_long dstCapacity;
  size_t sVar2;
  long lVar3;
  buffer local_48;
  
  dstCapacity = ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  lVar1 = (Output->Stream).Bytes;
  for (lVar3 = lVar1; lVar3 <= (long)(dstCapacity + 8); lVar3 = (lVar3 * 3) / 2 + 8) {
  }
  if ((lVar1 < lVar3) && (lVar1 < lVar3 + 8)) {
    Mallocator();
    local_48.Data = (byte *)0x0;
    local_48.Bytes = 0;
    local_48.Alloc = &Mallocator::Instance.super_allocator;
    AllocBuf(&local_48,lVar3 + 8,(Output->Stream).Alloc);
    MemCopy(&Output->Stream,&local_48,
            (u64)(Output->BitPtr + ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data))
           );
    Output->BitPtr = local_48.Data + ((long)Output->BitPtr - (long)(Output->Stream).Data);
    DeallocBuf(&Output->Stream);
    (Output->Stream).Alloc = local_48.Alloc;
    (Output->Stream).Data = local_48.Data;
    (Output->Stream).Bytes = local_48.Bytes;
  }
  sVar2 = ZSTD_decompress((Output->Stream).Data,dstCapacity,Input->Data,Input->Bytes);
  if (sVar2 == dstCapacity) {
    return;
  }
  fwrite("Zstd decompression failed\n",0x1a,1,_stderr);
  exit(1);
}

Assistant:

void
DecompressBufZstd(const buffer& Input, bitstream* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  GrowToAccomodate(Output, OutputSize - Size(*Output));
  size_t const Result = ZSTD_decompress(Output->Stream.Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}